

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int noentParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *r1;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr doc;
  void *pvVar5;
  char *extraout_RDX;
  char *filename_00;
  uint uVar6;
  char *pcVar7;
  void *ctx;
  int iStack_84;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  undefined8 uStack_68;
  char *pcStack_60;
  long lStack_58;
  char *pcStack_50;
  
  nb_tests = nb_tests + 1;
  uVar6 = options | 0x60;
  lVar4 = xmlReadFile(filename,0,uVar6);
  if (lVar4 == 0) {
    return 1;
  }
  pcVar7 = temp_directory;
  filename_00 = filename;
  r1 = resultFilename(filename,temp_directory,".res");
  if (r1 != (char *)0x0) {
    xmlSaveFile(r1,lVar4);
    iVar1 = compareFiles(r1,result);
    xmlFreeDoc(lVar4);
    lVar4 = xmlReadFile(filename,0,uVar6);
    if (lVar4 == 0) {
      return 1;
    }
    xmlSaveFile(r1,lVar4);
    iVar2 = compareFiles(r1,result);
    xmlFreeDoc(lVar4);
    unlink(r1);
    free(r1);
    return (uint)(iVar2 != 0 || iVar1 != 0);
  }
  noentParseTest_cold_1();
  uStack_68 = 1;
  nb_tests = nb_tests + 1;
  pcStack_60 = filename;
  lStack_58 = lVar4;
  pcStack_50 = result;
  if (((uint)options >> 0x1e & 1) == 0) {
    ctxt = (xmlParserCtxtPtr)xmlNewParserCtxt();
    xmlCtxtSetErrorHandler(ctxt,testStructuredErrorHandler,0);
    doc = (xmlDocPtr)xmlCtxtReadFile(ctxt,filename_00,0,options);
    if (((uint)options >> 10 & 1) != 0) {
      pcStack_78 = filename_00;
      pvVar5 = (void *)xmlXIncludeNewContext(doc);
      xmlXIncludeSetErrorHandler(pvVar5,testStructuredErrorHandler,0);
      xmlXIncludeSetFlags(pvVar5,options);
      ctx = pvVar5;
      iVar1 = xmlXIncludeProcessNode(pvVar5,doc);
      if (iVar1 < 0) {
        testErrorHandler(ctx,"%s : failed to parse\n",pcStack_78);
        xmlFreeDoc(doc);
        doc = (xmlDocPtr)0x0;
      }
      xmlXIncludeFreeContext(pvVar5);
      filename_00 = pcStack_78;
    }
  }
  else {
    ctxt = (xmlParserCtxtPtr)htmlNewParserCtxt();
    xmlCtxtSetErrorHandler(ctxt,testStructuredErrorHandler,0);
    doc = (xmlDocPtr)htmlCtxtReadFile(ctxt,filename_00,0,options);
  }
  pcStack_70 = extraout_RDX;
  if (pcVar7 == (char *)0x0) {
LAB_00108fdd:
    if (pcStack_70 == (char *)0x0) {
      iVar1 = 0;
      if (((options & 0x10U) == 0) || (testErrorsSize == 0)) goto LAB_00109064;
      pcVar7 = "Validation for %s failed\n";
    }
    else {
      iVar2 = compareFileMem(pcStack_70,testErrors,testErrorsSize);
      iVar1 = 0;
      if (iVar2 == 0) goto LAB_00109064;
      pcVar7 = "Error for %s failed\n";
    }
    fprintf(_stderr,pcVar7,filename_00);
  }
  else {
    pcStack_80 = (char *)0x0;
    if (doc == (xmlDocPtr)0x0) {
      pcStack_80 = (char *)xmlStrdup("");
      iStack_84 = 0;
    }
    else if (((uint)options >> 0x1e & 1) == 0) {
      xmlDocDumpMemory();
    }
    else {
      htmlDocDumpMemory(doc,&pcStack_80,&iStack_84);
    }
    iVar1 = compareFileMem(pcVar7,pcStack_80,iStack_84);
    (*_xmlFree)(pcStack_80);
    if (iVar1 == 0) goto LAB_00108fdd;
    fprintf(_stderr,"Result for %s failed in %s\n",filename_00,pcVar7);
  }
  iVar1 = -1;
LAB_00109064:
  iVar3 = testParseContent(ctxt,doc,filename_00);
  iVar2 = -1;
  if (-1 < iVar3) {
    iVar2 = iVar1;
  }
  xmlFreeDoc(doc);
  xmlFreeParserCtxt(ctxt);
  return iVar2;
}

Assistant:

static int
noentParseTest(const char *filename, const char *result,
               const char *err  ATTRIBUTE_UNUSED,
	       int options) {
    xmlDocPtr doc;
    char *temp;
    int res = 0;

    nb_tests++;
    /*
     * base of the test, parse with the old API
     */
    doc = xmlReadFile(filename, NULL,
                      options | XML_PARSE_NOWARNING | XML_PARSE_NOERROR);
    if (doc == NULL)
        return(1);
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    /*
     * Parse the saved result to make sure the round trip is okay
     */
    doc = xmlReadFile(filename, NULL,
                      options | XML_PARSE_NOWARNING | XML_PARSE_NOERROR);
    if (doc == NULL)
        return(1);
    xmlSaveFile(temp, doc);
    if (compareFiles(temp, result)) {
        res = 1;
    }
    xmlFreeDoc(doc);

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(res);
}